

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_union_suite.cpp
# Opt level: O3

void ctor_suite::copy_assign_int(void)

{
  test_union<int,_bool,_int> other;
  test_union<int,_bool,_int> data;
  undefined1 local_29;
  type local_28 [2];
  undefined8 local_20;
  type local_18 [2];
  undefined8 local_10;
  
  local_10 = 0;
  local_18[0].__data[0] = '\x01';
  local_28[0].__data[0] = '\x01';
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.get<bool>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/core/detail/small_union_suite.cpp"
             ,0x40,"void ctor_suite::copy_assign_int()",local_18,local_28);
  local_20 = 0;
  local_28[0].__data[0] = '\0';
  trial::dynamic::detail::small_union<std::allocator<char>,_int,_unsigned_long,_bool,_int>::
  operator=((small_union<std::allocator<char>,_int,_unsigned_long,_bool,_int> *)&local_28[0].__align
            ,(small_union<std::allocator<char>,_int,_unsigned_long,_bool,_int> *)
             &local_18[0].__align);
  local_29 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("other.get<bool>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/core/detail/small_union_suite.cpp"
             ,0x43,"void ctor_suite::copy_assign_int()",local_28,&local_29);
  trial::dynamic::detail::small_union<std::allocator<char>,int,unsigned_long,bool,int>::
  call<trial::dynamic::detail::small_union<std::allocator<char>,int,unsigned_long,bool,int>::destructor,void>
            ((small_union<std::allocator<char>,int,unsigned_long,bool,int> *)&local_28[0].__align);
  trial::dynamic::detail::small_union<std::allocator<char>,int,unsigned_long,bool,int>::
  call<trial::dynamic::detail::small_union<std::allocator<char>,int,unsigned_long,bool,int>::destructor,void>
            ((small_union<std::allocator<char>,int,unsigned_long,bool,int> *)&local_18[0].__align);
  return;
}

Assistant:

void copy_assign_int()
{
    test_union<int, bool, int> data{true};
    TRIAL_PROTOCOL_TEST_EQUAL(data.get<bool>(), true);
    test_union<int, bool, int> other{false};
    other = data;
    TRIAL_PROTOCOL_TEST_EQUAL(other.get<bool>(), true);
}